

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::InvalidatePropertyRecordUsageCache
          (ScriptContext *this,PropertyRecordUsageCache *propertyRecordUsageCache,Type *type)

{
  bool bVar1;
  uint uVar2;
  char16 *pcVar3;
  InlineCache *pIVar4;
  ThreadContext *pTVar5;
  PropertyCacheOperationInfo local_2b;
  PolymorphicInlineCache *pPStack_28;
  PropertyCacheOperationInfo info;
  PolymorphicInlineCache *cache;
  Type *type_local;
  PropertyRecordUsageCache *propertyRecordUsageCache_local;
  ScriptContext *this_local;
  
  pPStack_28 = PropertyRecordUsageCache::GetLdElemInlineCache(propertyRecordUsageCache);
  PropertyCacheOperationInfo::PropertyCacheOperationInfo(&local_2b);
  bVar1 = PolymorphicInlineCache::PretendTryGetProperty(pPStack_28,type,&local_2b);
  if (bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PropertyCachePhase);
    if (bVar1) {
      pcVar3 = PropertyRecordUsageCache::GetString(propertyRecordUsageCache);
      Output::Print(L"PropertyRecord \'%s\' : Invalidating LdElem cache for type %p\n",pcVar3,type);
    }
    pIVar4 = PolymorphicInlineCache::GetInlineCaches(pPStack_28);
    uVar2 = PolymorphicInlineCache::GetInlineCacheIndexForType(pPStack_28,type);
    pTVar5 = GetThreadContext(this);
    InlineCache::RemoveFromInvalidationListAndClear(pIVar4 + uVar2,pTVar5);
  }
  pPStack_28 = PropertyRecordUsageCache::GetStElemInlineCache(propertyRecordUsageCache);
  bVar1 = PolymorphicInlineCache::PretendTrySetProperty(pPStack_28,type,type,&local_2b);
  if (bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PropertyCachePhase);
    if (bVar1) {
      pcVar3 = PropertyRecordUsageCache::GetString(propertyRecordUsageCache);
      Output::Print(L"PropertyRecord \'%s\' : Invalidating StElem cache for type %p\n",pcVar3,type);
    }
    pIVar4 = PolymorphicInlineCache::GetInlineCaches(pPStack_28);
    uVar2 = PolymorphicInlineCache::GetInlineCacheIndexForType(pPStack_28,type);
    pTVar5 = GetThreadContext(this);
    InlineCache::RemoveFromInvalidationListAndClear(pIVar4 + uVar2,pTVar5);
  }
  return;
}

Assistant:

void ScriptContext::InvalidatePropertyRecordUsageCache(PropertyRecordUsageCache* propertyRecordUsageCache, Type *type)
    {
        PolymorphicInlineCache * cache = propertyRecordUsageCache->GetLdElemInlineCache();
        PropertyCacheOperationInfo info;
        if (cache->PretendTryGetProperty(type, &info))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE1(PropertyCachePhase))
            {
                Output::Print(_u("PropertyRecord '%s' : Invalidating LdElem cache for type %p\n"), propertyRecordUsageCache->GetString(), type);
            }
#endif
            cache->GetInlineCaches()[cache->GetInlineCacheIndexForType(type)].RemoveFromInvalidationListAndClear(this->GetThreadContext());
        }
        cache = propertyRecordUsageCache->GetStElemInlineCache();
        if (cache->PretendTrySetProperty(type, type, &info))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE1(PropertyCachePhase))
            {
                Output::Print(_u("PropertyRecord '%s' : Invalidating StElem cache for type %p\n"), propertyRecordUsageCache->GetString(), type);
            }
#endif
            cache->GetInlineCaches()[cache->GetInlineCacheIndexForType(type)].RemoveFromInvalidationListAndClear(this->GetThreadContext());
        }
    }